

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

bool proto2_unittest::V1EnumLite_Parse(string_view name,V1EnumLite *value)

{
  bool bVar1;
  int *in_R9;
  string_view name_00;
  V1EnumLite local_24;
  bool success;
  V1EnumLite *pVStack_20;
  int int_value;
  V1EnumLite *value_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  value_local = (V1EnumLite *)name._M_len;
  name_00._M_str = (char *)&local_24;
  name_00._M_len = name_local._M_len;
  pVStack_20 = value;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)V1EnumLite_entries,(EnumEntry *)0x1,(size_t)value_local,name_00,
                     in_R9);
  if (bVar1) {
    *pVStack_20 = local_24;
  }
  return bVar1;
}

Assistant:

bool V1EnumLite_Parse(::absl::string_view name, V1EnumLite* PROTOBUF_NONNULL value) {
  int int_value;
  bool success = ::google::protobuf::internal::LookUpEnumValue(
      V1EnumLite_entries, 1, name, &int_value);
  if (success) {
    *value = static_cast<V1EnumLite>(int_value);
  }
  return success;
}